

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::GlobalTimeCoordinator::transmitTimingMessagesUpstream
          (GlobalTimeCoordinator *this,ActionMessage *msg)

{
  bool bVar1;
  action_t aVar2;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  ActionMessage *in_stack_ffffffffffffffd0;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_20;
  GlobalFederateId *local_18;
  ActionMessage *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_helics::ActionMessage_&)> *)in_stack_ffffffffffffffd0);
  if (bVar1) {
    local_18 = &in_RDI->source_id;
    local_20._M_current = (DependencyInfo *)TimeDependencies::begin((TimeDependencies *)in_RDI);
    TimeDependencies::end((TimeDependencies *)in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)in_stack_ffffffffffffffd0,
                              (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffffd0 =
           (ActionMessage *)
           __gnu_cxx::
           __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
           ::operator*(&local_20);
      if (((in_stack_ffffffffffffffd0->payload).buffer._M_elems[0xd] != 2) &&
         (((in_stack_ffffffffffffffd0->payload).buffer._M_elems[0xe] & 1) != 0)) {
        (local_10->dest_id).gid =
             *(BaseType *)((in_stack_ffffffffffffffd0->payload).buffer._M_elems + 8);
        aVar2 = ActionMessage::action(local_10);
        if (aVar2 == cmd_exec_request) {
          ActionMessage::setExtraDestData
                    (in_stack_ffffffffffffffd0,(int32_t)((ulong)in_RDI >> 0x20));
        }
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)in_stack_ffffffffffffffd0,
                   in_RDI);
      }
      __gnu_cxx::
      __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void GlobalTimeCoordinator::transmitTimingMessagesUpstream(ActionMessage& msg) const
{
    if (!sendMessageFunction) {
        return;
    }

    for (const auto& dep : dependencies) {
        if (dep.connection == ConnectionType::CHILD) {
            continue;
        }
        if (!dep.dependent) {
            continue;
        }
        msg.dest_id = dep.fedID;
        if (msg.action() == CMD_EXEC_REQUEST) {
            msg.setExtraDestData(dep.sequenceCounter);
        }
        sendMessageFunction(msg);
    }
}